

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<18UL> *
mserialize::cx_strcat<4ul,3ul,1ul,3ul,2ul,3ul,1ul,1ul>
          (cx_string<4UL> *strings,cx_string<3UL> *strings_1,cx_string<1UL> *strings_2,
          cx_string<3UL> *strings_3,cx_string<2UL> *strings_4,cx_string<3UL> *strings_5,
          cx_string<1UL> *strings_6,cx_string<1UL> *strings_7)

{
  cx_string<1UL> *in_RCX;
  cx_string<3UL> *in_RDX;
  cx_string<4UL> *in_RSI;
  cx_string<18UL> *in_RDI;
  cx_string<3UL> *in_R8;
  cx_string<2UL> *in_R9;
  cx_string<3UL> *in_stack_00000008;
  cx_string<1UL> *in_stack_00000010;
  size_t s;
  size_t i;
  char *out;
  size_t size [9];
  char *data [9];
  char buffer [19];
  char *in_stack_ffffffffffffff00;
  ulong local_f8;
  char *local_f0;
  size_t local_e0 [9];
  char *local_98;
  data_ref local_90;
  data_ref local_88;
  data_ref local_80;
  data_ref local_78;
  data_ref local_70;
  data_ref local_68;
  data_ref local_60;
  data_ref local_58;
  char local_48 [32];
  cx_string<2UL> *local_28;
  cx_string<3UL> *local_20;
  cx_string<1UL> *local_18;
  cx_string<3UL> *local_10;
  cx_string<4UL> *local_8;
  
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  memset(local_48,0,0x13);
  local_98 = "";
  local_90 = cx_string<4UL>::data(local_8);
  local_88 = cx_string<3UL>::data(local_10);
  local_80 = cx_string<1UL>::data(local_18);
  local_78 = cx_string<3UL>::data(local_20);
  local_70 = cx_string<2UL>::data(local_28);
  local_68 = cx_string<3UL>::data(in_stack_00000008);
  local_60 = cx_string<1UL>::data(in_stack_00000010);
  local_58 = cx_string<1UL>::data((cx_string<1UL> *)s);
  local_e0[0] = cx_string<4UL>::size(local_8);
  local_e0[1] = cx_string<3UL>::size(local_10);
  local_e0[2] = cx_string<1UL>::size(local_18);
  local_e0[3] = cx_string<3UL>::size(local_20);
  local_e0[4] = cx_string<2UL>::size(local_28);
  local_e0[5] = cx_string<3UL>::size(in_stack_00000008);
  local_e0[6] = cx_string<1UL>::size(in_stack_00000010);
  local_e0[7] = cx_string<1UL>::size((cx_string<1UL> *)s);
  local_f0 = local_48;
  for (local_f8 = 1; local_f8 < 9; local_f8 = local_f8 + 1) {
    for (in_stack_ffffffffffffff00 = (char *)0x0;
        in_stack_ffffffffffffff00 < (cx_string<18UL> *)local_e0[local_f8 - 1];
        in_stack_ffffffffffffff00 = in_stack_ffffffffffffff00 + 1) {
      *local_f0 = in_stack_ffffffffffffff00[(long)(&local_98)[local_f8]];
      local_f0 = local_f0 + 1;
    }
  }
  cx_string<18UL>::cx_string((cx_string<18UL> *)in_stack_ffffffffffffff00,in_RDI->_data);
  return in_RDI;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}